

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.h
# Opt level: O2

bool CoreML::Specification::operator==(NonMaximumSuppression *a,NonMaximumSuppression *b)

{
  bool bVar1;
  NonMaximumSuppression_PickTop *pNVar2;
  
  if ((a->iouthreshold_ != b->iouthreshold_) || (NAN(a->iouthreshold_) || NAN(b->iouthreshold_))) {
    return false;
  }
  if ((((((a->confidencethreshold_ == b->confidencethreshold_) &&
         (!NAN(a->confidencethreshold_) && !NAN(b->confidencethreshold_))) &&
        (bVar1 = std::operator!=((a->confidenceinputfeaturename_).ptr_,
                                 (b->confidenceinputfeaturename_).ptr_), !bVar1)) &&
       ((bVar1 = std::operator!=((a->coordinatesinputfeaturename_).ptr_,
                                 (b->coordinatesinputfeaturename_).ptr_), !bVar1 &&
        (bVar1 = std::operator!=((a->iouthresholdinputfeaturename_).ptr_,
                                 (b->iouthresholdinputfeaturename_).ptr_), !bVar1)))) &&
      ((bVar1 = std::operator!=((a->confidencethresholdinputfeaturename_).ptr_,
                                (b->confidencethresholdinputfeaturename_).ptr_), !bVar1 &&
       ((bVar1 = std::operator!=((a->confidenceoutputfeaturename_).ptr_,
                                 (b->confidenceoutputfeaturename_).ptr_), !bVar1 &&
        (bVar1 = std::operator!=((a->coordinatesoutputfeaturename_).ptr_,
                                 (b->coordinatesoutputfeaturename_).ptr_), !bVar1)))))) &&
     (a->_oneof_case_[0] == b->_oneof_case_[0])) {
    if (a->_oneof_case_[0] == 1) {
      pNVar2 = NonMaximumSuppression::picktop(a);
      bVar1 = pNVar2->perclass_;
      pNVar2 = NonMaximumSuppression::picktop(b);
      if (bVar1 != pNVar2->perclass_) {
        return false;
      }
    }
    return true;
  }
  return false;
}

Assistant:

inline double NonMaximumSuppression::iouthreshold() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.NonMaximumSuppression.iouThreshold)
  return iouthreshold_;
}